

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O2

Pipeline * __thiscall
capnp::AnyPointer::Pipeline::noop(Pipeline *__return_storage_ptr__,Pipeline *this)

{
  size_t count;
  size_t sVar1;
  PipelineOp *pPVar2;
  unsigned_long i;
  size_t sVar3;
  Array<capnp::PipelineOp> newOps;
  Array<capnp::PipelineOp> local_58;
  Own<capnp::PipelineHook,_std::nullptr_t> local_38;
  
  count = (this->ops).size_;
  pPVar2 = kj::_::HeapArrayDisposer::allocate<capnp::PipelineOp>(count);
  local_58.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  sVar1 = (this->ops).size_;
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    pPVar2[sVar3] = (this->ops).ptr[sVar3];
  }
  local_58.ptr = pPVar2;
  local_58.size_ = count;
  (**((this->hook).ptr)->_vptr_PipelineHook)(&local_38);
  (__return_storage_ptr__->hook).disposer = local_38.disposer;
  (__return_storage_ptr__->hook).ptr = local_38.ptr;
  local_38.ptr = (PipelineHook *)0x0;
  (__return_storage_ptr__->ops).ptr = pPVar2;
  (__return_storage_ptr__->ops).size_ = count;
  (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_58.ptr = (PipelineOp *)0x0;
  local_58.size_ = 0;
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose(&local_38);
  kj::Array<capnp::PipelineOp>::~Array(&local_58);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline AnyPointer::Pipeline::noop() {
  auto newOps = kj::heapArray<PipelineOp>(ops.size());
  for (auto i: kj::indices(ops)) {
    newOps[i] = ops[i];
  }
  return Pipeline(hook->addRef(), kj::mv(newOps));
}